

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

string * serialization_pipeline<IsoForest>(string *__return_storage_ptr__,IsoForest *model)

{
  size_t sVar1;
  char *ptr;
  pointer local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = get_size_model(model);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)sVar1);
  local_20 = (__return_storage_ptr__->_M_dataplus)._M_p;
  serialization_pipeline<IsoForest,char*>(model,&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string serialization_pipeline(const Model &model)
{
    std::string serialized;
    serialized.resize(get_size_model(model));
    char *ptr = &serialized[0];
    serialization_pipeline(model, ptr);
    return serialized;
}